

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readptm.c
# Opt level: O0

int it_ptm_read_sample_header(IT_SAMPLE *sample,int32 *offset,DUMBFILE *f)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  DUMBFILE *in_RDX;
  DUMBFILE *in_RSI;
  long in_RDI;
  int flags;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = dumbfile_getc((DUMBFILE *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),in_RSI);
  *(undefined1 *)(in_RDI + 0x2f) = 0;
  iVar2 = dumbfile_getc((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(char *)(in_RDI + 0x34) = (char)iVar2;
  iVar2 = dumbfile_igetw((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(int *)(in_RDI + 0x44) = iVar2 << 1;
  dumbfile_skip(in_RSI,(long)in_RDX);
  iVar3 = dumbfile_igetl((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(int32 *)&in_RSI->dfs = iVar3;
  iVar3 = dumbfile_igetl((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(int32 *)(in_RDI + 0x38) = iVar3;
  iVar3 = dumbfile_igetl((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(int32 *)(in_RDI + 0x3c) = iVar3;
  iVar3 = dumbfile_igetl((DUMBFILE *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  *(int32 *)(in_RDI + 0x40) = iVar3;
  dumbfile_skip(in_RSI,(long)in_RDX);
  dumbfile_getnc((char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (int32)((ulong)in_RDI >> 0x20),in_RSI);
  *(undefined1 *)(in_RDI + 0x1c) = 0;
  dumbfile_skip(in_RSI,(long)in_RDX);
  if ((uVar1 & 3) == 0) {
    *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xfe;
    iVar2 = dumbfile_error(in_RDX);
  }
  else {
    *(undefined1 *)(in_RDI + 0x33) = 0x40;
    *(undefined1 *)(in_RDI + 0x32) = 1;
    if ((uVar1 & 4) != 0) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x10;
    }
    if ((uVar1 & 8) != 0) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 0x40;
    }
    if ((uVar1 & 0x10) != 0) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) | 2;
      *(int *)(in_RDI + 0x38) = *(int *)(in_RDI + 0x38) >> 1;
      *(int *)(in_RDI + 0x3c) = *(int *)(in_RDI + 0x3c) >> 1;
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) >> 1;
    }
    if (*(int *)(in_RDI + 0x40) != 0) {
      *(int *)(in_RDI + 0x40) = *(int *)(in_RDI + 0x40) + -1;
    }
    *(undefined1 *)(in_RDI + 0x35) = 0;
    if (*(int *)(in_RDI + 0x38) < 1) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xfe;
    }
    else if ((*(byte *)(in_RDI + 0x32) & 0x10) != 0) {
      if (*(uint *)(in_RDI + 0x38) < *(uint *)(in_RDI + 0x40)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xef;
      }
      else if (*(uint *)(in_RDI + 0x3c) < *(uint *)(in_RDI + 0x40)) {
        *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
      }
      else {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xef;
      }
    }
    *(undefined1 *)(in_RDI + 0x50) = 0;
    *(undefined1 *)(in_RDI + 0x51) = 0;
    *(undefined1 *)(in_RDI + 0x52) = 0;
    *(undefined1 *)(in_RDI + 0x53) = 0;
    *(undefined2 *)(in_RDI + 0x54) = 0;
    *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
    iVar2 = dumbfile_error(in_RDX);
  }
  return iVar2;
}

Assistant:

static int it_ptm_read_sample_header(IT_SAMPLE *sample, int32 *offset, DUMBFILE *f)
{
	int flags;

	flags = dumbfile_getc(f);

    dumbfile_getnc((char *)sample->filename, 12, f);
	sample->filename[12] = 0;

	sample->default_volume = dumbfile_getc(f);

	sample->C5_speed = dumbfile_igetw(f) << 1;

	dumbfile_skip(f, 2); /* segment */

	*offset = dumbfile_igetl(f);

	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);

	/* GUSBegin, GUSLStart, GUSLEnd, GUSLoop, reserverd */
	dumbfile_skip(f, 4+4+4+1+1);

    dumbfile_getnc((char *)sample->name, 28, f);
	sample->name[28] = 0;

	/*
	if (dumbfile_mgetl(f) != DUMB_ID('P','T','M','S'))
		return -1;
	*/

	/* BLAH! Shit likes to have broken or missing sample IDs */
	dumbfile_skip(f, 4);

	if ((flags & 3) == 0) {
		/* Looks like no sample */
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return dumbfile_error(f);
	}

	sample->global_volume = 64;

	sample->flags = IT_SAMPLE_EXISTS;
	if (flags & 4) sample->flags |= IT_SAMPLE_LOOP;
	if (flags & 8) sample->flags |= IT_SAMPLE_PINGPONG_LOOP;

	if (flags & 16) {
		sample->flags |= IT_SAMPLE_16BIT;

		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}

	if (sample->loop_end) sample->loop_end--;

	sample->default_pan = 0; // 0 = don't use, or 160 = centre?

	if (sample->length <= 0)
		sample->flags &= ~IT_SAMPLE_EXISTS;
	else if (sample->flags & IT_SAMPLE_LOOP) {
		if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
			sample->flags &= ~IT_SAMPLE_LOOP;
		else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
			sample->flags &= ~IT_SAMPLE_LOOP;
		else
			sample->length = sample->loop_end;
	}


	//Do we need to set all these?
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}